

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  undefined1 uVar1;
  stbi_uc sVar2;
  stbi__uint16 sVar3;
  stbi__uint32 sVar4;
  int iVar5;
  stbi__uint32 sVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ushort *puVar10;
  undefined4 *in_RCX;
  stbi__uint32 *in_RDX;
  stbi__uint32 *in_RSI;
  stbi__context *in_RDI;
  int in_R8D;
  int *in_R9;
  float fVar11;
  float fVar12;
  int in_stack_00000008;
  float inv_a_1;
  float ra_1;
  float a_1;
  uchar *pixel_1;
  float inv_a;
  float ra;
  float a;
  stbi__uint16 *pixel;
  stbi_uc *p_2;
  stbi__uint16 *q_1;
  stbi_uc val_1;
  stbi_uc *p_1;
  stbi__uint16 val;
  stbi__uint16 *q;
  stbi_uc *p;
  stbi_uc *out;
  int h;
  int w;
  int bitdepth;
  int i;
  int channel;
  int compression;
  int channelCount;
  int pixelCount;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  stbi__context *in_stack_ffffffffffffff20;
  stbi__context *s_00;
  stbi__context *psVar13;
  uint in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  stbi__uint16 *in_stack_ffffffffffffff48;
  stbi_uc *local_98;
  stbi__uint16 *local_90;
  undefined1 *local_80;
  stbi__uint16 *local_70;
  undefined1 *local_68;
  stbi__uint16 *local_60;
  int local_4c;
  int local_48;
  stbi__uint16 *local_8;
  
  sVar4 = stbi__get32be(in_stack_ffffffffffffff20);
  if (sVar4 == 0x38425053) {
    iVar5 = stbi__get16be(in_stack_ffffffffffffff20);
    if (iVar5 == 1) {
      stbi__skip(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      iVar5 = stbi__get16be(in_stack_ffffffffffffff20);
      if ((iVar5 < 0) || (0x10 < iVar5)) {
        stbi__err("wrong channel count");
        local_8 = (stbi__uint16 *)0x0;
      }
      else {
        sVar4 = stbi__get32be(in_stack_ffffffffffffff20);
        sVar6 = stbi__get32be(in_stack_ffffffffffffff20);
        if ((int)sVar4 < 0x1000001) {
          if ((int)sVar6 < 0x1000001) {
            iVar7 = stbi__get16be(in_stack_ffffffffffffff20);
            if ((iVar7 == 8) || (iVar7 == 0x10)) {
              iVar8 = stbi__get16be(in_stack_ffffffffffffff20);
              if (iVar8 == 3) {
                s_00 = in_RDI;
                stbi__get32be(in_RDI);
                stbi__skip(s_00,in_stack_ffffffffffffff1c);
                psVar13 = in_RDI;
                stbi__get32be(s_00);
                stbi__skip(s_00,in_stack_ffffffffffffff1c);
                stbi__get32be(s_00);
                stbi__skip(s_00,in_stack_ffffffffffffff1c);
                iVar8 = stbi__get16be(s_00);
                if (iVar8 < 2) {
                  iVar9 = stbi__mad3sizes_valid
                                    ((int)((ulong)s_00 >> 0x20),(int)s_00,in_stack_ffffffffffffff1c,
                                     in_stack_ffffffffffffff18);
                  if (iVar9 == 0) {
                    stbi__err("too large");
                    local_8 = (stbi__uint16 *)0x0;
                  }
                  else {
                    if (((iVar8 == 0) && (iVar7 == 0x10)) && (in_stack_00000008 == 0x10)) {
                      local_60 = (stbi__uint16 *)
                                 stbi__malloc_mad3(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18,0,0x118c45);
                      *in_R9 = 0x10;
                    }
                    else {
                      local_60 = (stbi__uint16 *)stbi__malloc(0x118c77);
                    }
                    if (local_60 == (stbi__uint16 *)0x0) {
                      stbi__err("outofmem");
                      local_8 = (stbi__uint16 *)0x0;
                    }
                    else {
                      iVar9 = sVar6 * sVar4;
                      if (iVar8 == 0) {
                        for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
                          if (local_48 < iVar5) {
                            if (*in_R9 == 0x10) {
                              local_90 = local_60 + local_48;
                              for (local_4c = 0; local_4c < iVar9; local_4c = local_4c + 1) {
                                iVar8 = stbi__get16be(s_00);
                                *local_90 = (stbi__uint16)iVar8;
                                local_90 = local_90 + 4;
                              }
                            }
                            else {
                              local_98 = (stbi_uc *)((long)local_60 + (long)local_48);
                              if (iVar7 == 0x10) {
                                for (local_4c = 0; local_4c < iVar9; local_4c = local_4c + 1) {
                                  iVar8 = stbi__get16be(s_00);
                                  *local_98 = (stbi_uc)((uint)iVar8 >> 8);
                                  local_98 = local_98 + 4;
                                }
                              }
                              else {
                                for (local_4c = 0; local_4c < iVar9; local_4c = local_4c + 1) {
                                  sVar2 = stbi__get8((stbi__context *)
                                                     CONCAT44(in_stack_ffffffffffffff1c,
                                                              in_stack_ffffffffffffff18));
                                  *local_98 = sVar2;
                                  local_98 = local_98 + 4;
                                }
                              }
                            }
                          }
                          else if ((iVar7 == 0x10) && (in_stack_00000008 == 0x10)) {
                            local_70 = local_60 + local_48;
                            sVar3 = 0;
                            if (local_48 == 3) {
                              sVar3 = 0xffff;
                            }
                            for (local_4c = 0; local_4c < iVar9; local_4c = local_4c + 1) {
                              *local_70 = sVar3;
                              local_70 = local_70 + 4;
                            }
                          }
                          else {
                            local_80 = (undefined1 *)((long)local_60 + (long)local_48);
                            uVar1 = 0;
                            if (local_48 == 3) {
                              uVar1 = 0xff;
                            }
                            for (local_4c = 0; local_4c < iVar9; local_4c = local_4c + 1) {
                              *local_80 = uVar1;
                              local_80 = local_80 + 4;
                            }
                          }
                        }
                      }
                      else {
                        stbi__skip(s_00,in_stack_ffffffffffffff1c);
                        for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
                          local_68 = (undefined1 *)((long)local_60 + (long)local_48);
                          if (local_48 < iVar5) {
                            iVar7 = stbi__psd_decode_rle
                                              ((stbi__context *)
                                               CONCAT44(in_stack_ffffffffffffff3c,
                                                        in_stack_ffffffffffffff38),(stbi_uc *)in_RDI
                                               ,(int)((ulong)psVar13 >> 0x20));
                            if (iVar7 == 0) {
                              free(local_60);
                              stbi__err("corrupt");
                              return (void *)0x0;
                            }
                          }
                          else {
                            for (local_4c = 0; local_4c < iVar9; local_4c = local_4c + 1) {
                              uVar1 = 0;
                              if (local_48 == 3) {
                                uVar1 = 0xff;
                              }
                              *local_68 = uVar1;
                              local_68 = local_68 + 4;
                            }
                          }
                        }
                      }
                      if (3 < iVar5) {
                        if (*in_R9 == 0x10) {
                          for (local_4c = 0; local_4c < (int)(sVar6 * sVar4);
                              local_4c = local_4c + 1) {
                            puVar10 = local_60 + (local_4c << 2);
                            if ((puVar10[3] != 0) && (puVar10[3] != 0xffff)) {
                              fVar12 = 1.0 / ((float)puVar10[3] / 65535.0);
                              fVar11 = (1.0 - fVar12) * 65535.0;
                              *puVar10 = (ushort)(int)((float)*puVar10 * fVar12 + fVar11);
                              puVar10[1] = (ushort)(int)((float)puVar10[1] * fVar12 + fVar11);
                              puVar10[2] = (ushort)(int)((float)puVar10[2] * fVar12 + fVar11);
                            }
                          }
                        }
                        else {
                          for (local_4c = 0; local_4c < (int)(sVar6 * sVar4);
                              local_4c = local_4c + 1) {
                            in_stack_ffffffffffffff48 =
                                 (stbi__uint16 *)((long)local_60 + (long)(local_4c << 2));
                            if ((*(byte *)((long)in_stack_ffffffffffffff48 + 3) != 0) &&
                               (*(byte *)((long)in_stack_ffffffffffffff48 + 3) != 0xff)) {
                              in_stack_ffffffffffffff44 =
                                   (float)*(byte *)((long)in_stack_ffffffffffffff48 + 3) / 255.0;
                              in_stack_ffffffffffffff40 = 1.0 / in_stack_ffffffffffffff44;
                              in_stack_ffffffffffffff3c = (1.0 - in_stack_ffffffffffffff40) * 255.0;
                              *(byte *)in_stack_ffffffffffffff48 =
                                   (byte)(int)((float)(byte)*in_stack_ffffffffffffff48 *
                                               in_stack_ffffffffffffff40 + in_stack_ffffffffffffff3c
                                              );
                              *(byte *)((long)in_stack_ffffffffffffff48 + 1) =
                                   (byte)(int)((float)*(byte *)((long)in_stack_ffffffffffffff48 + 1)
                                               * in_stack_ffffffffffffff40 +
                                              in_stack_ffffffffffffff3c);
                              *(byte *)(in_stack_ffffffffffffff48 + 1) =
                                   (byte)(int)((float)(byte)in_stack_ffffffffffffff48[1] *
                                               in_stack_ffffffffffffff40 + in_stack_ffffffffffffff3c
                                              );
                            }
                          }
                        }
                      }
                      if ((in_R8D != 0) && (in_R8D != 4)) {
                        if (*in_R9 == 0x10) {
                          local_60 = stbi__convert_format16
                                               (in_stack_ffffffffffffff48,
                                                (int)in_stack_ffffffffffffff44,
                                                (int)in_stack_ffffffffffffff40,
                                                (uint)in_stack_ffffffffffffff3c,
                                                in_stack_ffffffffffffff38);
                        }
                        else {
                          local_60 = (stbi__uint16 *)
                                     stbi__convert_format
                                               ((uchar *)in_stack_ffffffffffffff48,
                                                (int)in_stack_ffffffffffffff44,
                                                (int)in_stack_ffffffffffffff40,
                                                (uint)in_stack_ffffffffffffff3c,
                                                in_stack_ffffffffffffff38);
                        }
                        if (local_60 == (stbi__uint16 *)0x0) {
                          return (void *)0x0;
                        }
                      }
                      if (in_RCX != (undefined4 *)0x0) {
                        *in_RCX = 4;
                      }
                      *in_RDX = sVar4;
                      *in_RSI = sVar6;
                      local_8 = local_60;
                    }
                  }
                }
                else {
                  stbi__err("bad compression");
                  local_8 = (stbi__uint16 *)0x0;
                }
              }
              else {
                stbi__err("wrong color format");
                local_8 = (stbi__uint16 *)0x0;
              }
            }
            else {
              stbi__err("unsupported bit depth");
              local_8 = (stbi__uint16 *)0x0;
            }
          }
          else {
            stbi__err("too large");
            local_8 = (stbi__uint16 *)0x0;
          }
        }
        else {
          stbi__err("too large");
          local_8 = (stbi__uint16 *)0x0;
        }
      }
    }
    else {
      stbi__err("wrong version");
      local_8 = (stbi__uint16 *)0x0;
    }
  }
  else {
    stbi__err("not PSD");
    local_8 = (stbi__uint16 *)0x0;
  }
  return local_8;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   if (h > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (w > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}